

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O1

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,MethodPrototypeSymbol *symbol)

{
  bool bVar1;
  SubroutineSymbol *symbol_00;
  MethodPrototypeSymbol *local_18;
  
  bVar1 = handleDefault<slang::ast::MethodPrototypeSymbol>(this,symbol);
  if (bVar1) {
    symbol_00 = MethodPrototypeSymbol::getSubroutine(symbol);
    if (symbol_00 != (SubroutineSymbol *)0x0) {
      handle(this,symbol_00);
    }
    if (((symbol->flags).m_bits & 0x10) != 0) {
      local_18 = symbol;
      SmallVectorBase<slang::ast::MethodPrototypeSymbol_const*>::
      emplace_back<slang::ast::MethodPrototypeSymbol_const*>
                ((SmallVectorBase<slang::ast::MethodPrototypeSymbol_const*> *)
                 &this->externIfaceProtos,&local_18);
      Compilation::noteCannotCache(this->compilation,(symbol->super_Symbol).parentScope);
    }
  }
  return;
}

Assistant:

void handle(const MethodPrototypeSymbol& symbol) {
        if (!handleDefault(symbol))
            return;

        if (auto sub = symbol.getSubroutine())
            handle(*sub);

        if (symbol.flags.has(MethodFlags::InterfaceExtern)) {
            externIfaceProtos.push_back(&symbol);

            auto scope = symbol.getParentScope();
            SLANG_ASSERT(scope);
            compilation.noteCannotCache(*scope);
        }
    }